

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  uint uVar6;
  __m128i *palVar7;
  int iVar8;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar9;
  __m128i *palVar10;
  __m128i *b_00;
  long lVar11;
  bool bVar12;
  uint uVar13;
  long lVar14;
  undefined8 extraout_RDX;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong size;
  long lVar21;
  __m128i *ptr;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  ulong uVar26;
  int iVar29;
  undefined1 auVar27 [16];
  int iVar30;
  undefined1 auVar28 [16];
  int iVar35;
  int iVar36;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar37;
  undefined1 auVar34 [16];
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i c;
  __m128i c_00;
  int32_t column_len;
  uint local_bc;
  ulong local_a0;
  size_t len;
  longlong extraout_RDX_00;
  uint uVar25;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse2_128_32_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sw_table_striped_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse2_128_32_cold_4();
        }
        else {
          uVar15 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse2_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse2_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse2_128_32_cold_1();
          }
          else {
            uVar1 = (ulong)uVar3 + 3;
            uVar13 = 0x7ffffffe - ppVar5->max;
            uVar19 = (ulong)uVar13;
            result = parasail_result_new_table1((uint)uVar1 & 0x7ffffffc,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 2;
              result->flag = result->flag | 0x4420804;
              b = parasail_memalign___m128i(0x10,size);
              palVar9 = parasail_memalign___m128i(0x10,size);
              palVar10 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              bVar12 = palVar9 == (__m128i *)0x0 || b == (__m128i *)0x0;
              len = CONCAT71((int7)(uVar19 >> 8),bVar12);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_00 == (__m128i *)0x0 || palVar10 == (__m128i *)0x0) || bVar12;
              if ((b_00 != (__m128i *)0x0 && palVar10 != (__m128i *)0x0) &&
                  (palVar9 != (__m128i *)0x0 && b != (__m128i *)0x0)) {
                local_a0 = 0;
                c[0] = size;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                uVar6 = (uint)size;
                lVar17 = size * uVar15;
                local_bc = 0xc0000000;
                lVar14 = 0;
                uVar19 = 0;
                auVar22 = _DAT_008d0d70;
                auVar23 = _DAT_008d0d70;
                do {
                  ptr = b;
                  iVar8 = ppVar5->mapper[(byte)s2[uVar19]];
                  palVar7 = palVar10;
                  b = palVar9;
                  if ((int)local_a0 == (int)uVar19 + -2) {
                    palVar7 = palVar9;
                    b = palVar10;
                  }
                  palVar10 = palVar7;
                  palVar9 = ptr + (uVar6 - 1);
                  iVar18 = (int)(*palVar9)[0];
                  iVar29 = *(int *)((long)*palVar9 + 4);
                  iVar30 = (int)(*palVar9)[1];
                  iVar20 = 0;
                  lVar11 = 0;
                  auVar27 = (undefined1  [16])0x0;
                  lVar16 = lVar14;
                  do {
                    piVar2 = (int *)((long)pvVar4 + lVar11 + size * (long)iVar8 * 0x10);
                    auVar39._0_4_ = iVar20 + *piVar2;
                    auVar39._4_4_ = iVar18 + piVar2[1];
                    auVar39._8_4_ = iVar29 + piVar2[2];
                    auVar39._12_4_ = iVar30 + piVar2[3];
                    auVar33 = *(undefined1 (*) [16])((long)*b_00 + lVar11);
                    auVar44._0_4_ = -(uint)(auVar33._0_4_ < auVar39._0_4_);
                    auVar44._4_4_ = -(uint)(auVar33._4_4_ < auVar39._4_4_);
                    auVar44._8_4_ = -(uint)(auVar33._8_4_ < auVar39._8_4_);
                    auVar44._12_4_ = -(uint)(auVar33._12_4_ < auVar39._12_4_);
                    auVar45 = ~auVar44 & auVar33 | auVar39 & auVar44;
                    auVar48._0_4_ = -(uint)(auVar27._0_4_ < auVar45._0_4_);
                    auVar48._4_4_ = -(uint)(auVar27._4_4_ < auVar45._4_4_);
                    auVar48._8_4_ = -(uint)(auVar27._8_4_ < auVar45._8_4_);
                    auVar48._12_4_ = -(uint)(auVar27._12_4_ < auVar45._12_4_);
                    auVar45 = ~auVar48 & auVar27 | auVar45 & auVar48;
                    auVar40._0_4_ = -(uint)(0 < auVar45._0_4_);
                    auVar40._4_4_ = -(uint)(0 < auVar45._4_4_);
                    auVar40._8_4_ = -(uint)(0 < auVar45._8_4_);
                    auVar40._12_4_ = -(uint)(0 < auVar45._12_4_);
                    auVar40 = auVar40 & auVar45;
                    *(undefined1 (*) [16])((long)*b + lVar11) = auVar40;
                    piVar2 = ((result->field_4).rowcols)->score_row;
                    iVar20 = auVar40._0_4_;
                    *(int *)((long)piVar2 + lVar16) = iVar20;
                    iVar18 = auVar40._4_4_;
                    iVar29 = auVar40._8_4_;
                    iVar30 = auVar40._12_4_;
                    *(int *)((long)piVar2 + lVar17 * 4 + lVar16) = iVar18;
                    *(int *)((long)piVar2 + lVar17 * 8 + lVar16) = iVar29;
                    *(int *)((long)piVar2 + lVar17 * 0xc + lVar16) = iVar30;
                    auVar46._0_4_ = -(uint)(auVar23._0_4_ < iVar20);
                    auVar46._4_4_ = -(uint)(auVar23._4_4_ < iVar18);
                    auVar46._8_4_ = -(uint)(auVar23._8_4_ < iVar29);
                    auVar46._12_4_ = -(uint)(auVar23._12_4_ < iVar30);
                    auVar23 = ~auVar46 & auVar23 | auVar40 & auVar46;
                    auVar41._0_4_ = iVar20 - open;
                    auVar41._4_4_ = iVar18 - open;
                    auVar41._8_4_ = iVar29 - open;
                    auVar41._12_4_ = iVar30 - open;
                    auVar31._0_4_ = auVar33._0_4_ - gap;
                    auVar31._4_4_ = auVar33._4_4_ - gap;
                    auVar31._8_4_ = auVar33._8_4_ - gap;
                    auVar31._12_4_ = auVar33._12_4_ - gap;
                    auVar47._0_4_ = -(uint)(auVar41._0_4_ < auVar31._0_4_);
                    auVar47._4_4_ = -(uint)(auVar41._4_4_ < auVar31._4_4_);
                    auVar47._8_4_ = -(uint)(auVar41._8_4_ < auVar31._8_4_);
                    auVar47._12_4_ = -(uint)(auVar41._12_4_ < auVar31._12_4_);
                    *(undefined1 (*) [16])((long)*b_00 + lVar11) =
                         ~auVar47 & auVar41 | auVar31 & auVar47;
                    auVar33._0_4_ = auVar27._0_4_ - gap;
                    auVar33._4_4_ = auVar27._4_4_ - gap;
                    auVar33._8_4_ = auVar27._8_4_ - gap;
                    auVar33._12_4_ = auVar27._12_4_ - gap;
                    auVar45._0_4_ = -(uint)(auVar41._0_4_ < auVar33._0_4_);
                    auVar45._4_4_ = -(uint)(auVar41._4_4_ < auVar33._4_4_);
                    auVar45._8_4_ = -(uint)(auVar41._8_4_ < auVar33._8_4_);
                    auVar45._12_4_ = -(uint)(auVar41._12_4_ < auVar33._12_4_);
                    auVar27 = ~auVar45 & auVar41 | auVar33 & auVar45;
                    piVar2 = (int *)((long)*ptr + lVar11);
                    iVar20 = *piVar2;
                    iVar18 = piVar2[1];
                    iVar29 = piVar2[2];
                    iVar30 = piVar2[3];
                    lVar11 = lVar11 + 0x10;
                    lVar16 = lVar16 + uVar15 * 4;
                  } while (size << 4 != lVar11);
                  iVar8 = 0;
                  do {
                    lVar16 = auVar27._8_8_;
                    uVar26 = auVar27._0_8_;
                    auVar27._0_8_ = uVar26 << 0x20;
                    auVar27._8_8_ = lVar16 << 0x20 | uVar26 >> 0x20;
                    lVar11 = 0;
                    lVar16 = lVar14;
                    do {
                      auVar33 = *(undefined1 (*) [16])((long)*b + lVar11);
                      auVar32._0_4_ = -(uint)(auVar27._0_4_ < auVar33._0_4_);
                      iVar18 = auVar27._4_4_;
                      auVar32._4_4_ = -(uint)(iVar18 < auVar33._4_4_);
                      iVar29 = auVar27._8_4_;
                      auVar32._8_4_ = -(uint)(iVar29 < auVar33._8_4_);
                      iVar30 = auVar27._12_4_;
                      auVar32._12_4_ = -(uint)(iVar30 < auVar33._12_4_);
                      auVar33 = ~auVar32 & auVar27 | auVar33 & auVar32;
                      *(undefined1 (*) [16])((long)*b + lVar11) = auVar33;
                      piVar2 = ((result->field_4).rowcols)->score_row;
                      iVar20 = auVar33._0_4_;
                      *(int *)((long)piVar2 + lVar16) = iVar20;
                      lVar21 = (long)piVar2 + lVar16;
                      iVar35 = auVar33._4_4_;
                      iVar36 = auVar33._8_4_;
                      iVar37 = auVar33._12_4_;
                      *(int *)(lVar17 * 4 + lVar21) = iVar35;
                      *(int *)(lVar17 * 8 + lVar21) = iVar36;
                      *(int *)(lVar17 * 0xc + lVar21) = iVar37;
                      auVar42._0_4_ = -(uint)(auVar23._0_4_ < iVar20);
                      auVar42._4_4_ = -(uint)(auVar23._4_4_ < iVar35);
                      auVar42._8_4_ = -(uint)(auVar23._8_4_ < iVar36);
                      auVar42._12_4_ = -(uint)(auVar23._12_4_ < iVar37);
                      auVar23 = ~auVar42 & auVar23 | auVar33 & auVar42;
                      auVar27._0_4_ = auVar27._0_4_ - gap;
                      auVar27._4_4_ = iVar18 - gap;
                      auVar27._8_4_ = iVar29 - gap;
                      auVar27._12_4_ = iVar30 - gap;
                      auVar43._0_4_ = -(uint)(iVar20 - open < auVar27._0_4_);
                      auVar43._4_4_ = -(uint)(iVar35 - open < auVar27._4_4_);
                      auVar43._8_4_ = -(uint)(iVar36 - open < auVar27._8_4_);
                      auVar43._12_4_ = -(uint)(iVar37 - open < auVar27._12_4_);
                      iVar20 = movmskps((int)lVar21,auVar43);
                      if (iVar20 == 0) goto LAB_005b5e74;
                      lVar11 = lVar11 + 0x10;
                      lVar16 = lVar16 + uVar15 * 4;
                    } while (size << 4 != lVar11);
                    iVar8 = iVar8 + 1;
                  } while (iVar8 != 4);
LAB_005b5e74:
                  auVar28._0_4_ = -(uint)(auVar22._0_4_ < auVar23._0_4_);
                  auVar28._4_4_ = -(uint)(auVar22._4_4_ < auVar23._4_4_);
                  iVar20 = auVar23._8_4_;
                  iVar18 = auVar23._12_4_;
                  auVar28._8_4_ = -(uint)(auVar22._8_4_ < iVar20);
                  auVar28._12_4_ = -(uint)(auVar22._12_4_ < iVar18);
                  iVar8 = movmskps((int)lVar16,auVar28);
                  bVar12 = true;
                  if (iVar8 != 0) {
                    auVar34._0_4_ = -(uint)(iVar20 < auVar23._0_4_);
                    auVar34._4_4_ = -(uint)(iVar18 < auVar23._4_4_);
                    auVar34._8_4_ = -(uint)(0 < iVar20);
                    auVar34._12_4_ = -(uint)(0 < iVar18);
                    auVar27 = ~auVar34 & auVar23 >> 0x40 | auVar23 & auVar34;
                    uVar25 = auVar27._0_4_;
                    uVar38 = auVar27._4_4_;
                    uVar24 = -(uint)((int)uVar38 < (int)uVar25);
                    local_bc = ~uVar24 & uVar38 | uVar25 & uVar24;
                    if ((int)uVar13 < (int)local_bc) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      bVar12 = false;
                    }
                    else {
                      auVar22._4_4_ = local_bc;
                      auVar22._0_4_ = local_bc;
                      auVar22._8_4_ = local_bc;
                      auVar22._12_4_ = local_bc;
                      local_a0 = uVar19 & 0xffffffff;
                    }
                  }
                  iVar8 = (int)uVar19;
                  if (!bVar12) break;
                  uVar19 = uVar19 + 1;
                  lVar14 = lVar14 + 4;
                  palVar9 = ptr;
                  iVar8 = s2Len;
                } while (uVar19 != uVar15);
                if (local_bc == 0x7fffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar20 = parasail_result_is_saturated(result);
                palVar9 = palVar10;
                if (iVar20 == 0) {
                  iVar20 = (int)local_a0;
                  palVar7 = ptr;
                  if (iVar20 == iVar8 + -2) {
                    palVar9 = ptr;
                    palVar7 = palVar10;
                  }
                  if (iVar20 == iVar8 + -1) {
                    palVar9 = b;
                    b = palVar10;
                    palVar7 = ptr;
                  }
                  ptr = palVar7;
                  iVar8 = uVar3 - 1;
                  if ((uVar1 & 0x7ffffffc) != 0) {
                    uVar15 = 0;
                    do {
                      if ((*(uint *)((long)*palVar9 + uVar15 * 4) == local_bc) &&
                         (iVar18 = ((uint)uVar15 & 3) * uVar6 + ((uint)(uVar15 >> 2) & 0x3fffffff),
                         iVar18 < iVar8)) {
                        iVar8 = iVar18;
                      }
                      uVar15 = uVar15 + 1;
                    } while ((uVar6 & 0x1fffffff) << 2 != (int)uVar15);
                  }
                }
                else {
                  iVar20 = 0;
                  local_bc = 0x7fffffff;
                  iVar8 = 0;
                }
                result->score = local_bc;
                result->end_query = iVar8;
                result->end_ref = iVar20;
                parasail_free(b_00);
                parasail_free(palVar9);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32_rpl(vH, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            vH = _mm_max_epi32_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}